

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioutils.cpp
# Opt level: O3

bool QMakeInternal::IoUtils::readLinkTarget(QString *symlinkPath,QString *target)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  ssize_t sVar4;
  uint uVar5;
  char *__path;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  char s [4097];
  QByteArray local_1080;
  QArrayData *local_1068;
  char16_t *pcStack_1060;
  qsizetype local_1058;
  QArrayData *local_1048;
  char *pcStack_1040;
  undefined1 *local_1038;
  char local_1028 [4104];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_1038 = &DAT_aaaaaaaaaaaaaaaa;
  local_1048 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pcStack_1040 = &DAT_aaaaaaaaaaaaaaaa;
  QString::toLocal8Bit_helper((QChar *)&local_1048,(longlong)(symlinkPath->d).ptr);
  memset(local_1028,0xaa,0x1001);
  __path = pcStack_1040;
  if (pcStack_1040 == (char *)0x0) {
    __path = (char *)&QByteArray::_empty;
  }
  sVar4 = readlink(__path,local_1028,0x1000);
  uVar5 = (uint)sVar4;
  if (0 < (int)uVar5) {
    QByteArray::QByteArray(&local_1080,local_1028,(ulong)(uVar5 & 0x7fffffff));
    QVar6.m_data = (storage_type *)local_1080.d.size;
    QVar6.m_size = (qsizetype)&local_1068;
    QString::fromLocal8Bit(QVar6);
    pQVar1 = &((target->d).d)->super_QArrayData;
    pcVar2 = (target->d).ptr;
    (target->d).d = (Data *)local_1068;
    (target->d).ptr = pcStack_1060;
    qVar3 = (target->d).size;
    (target->d).size = local_1058;
    local_1068 = pQVar1;
    pcStack_1060 = pcVar2;
    local_1058 = qVar3;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
    if (&(local_1080.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1080.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1080.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_1080.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_1080.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  if (local_1048 != (QArrayData *)0x0) {
    LOCK();
    (local_1048->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_1048->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_1048->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_1048,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return 0 < (int)uVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool IoUtils::readLinkTarget(const QString &symlinkPath, QString *target)
{
    const QByteArray localSymlinkPath = QFile::encodeName(symlinkPath);
#  if defined(__GLIBC__) && !defined(PATH_MAX)
#    define PATH_CHUNK_SIZE 256
    char *s = 0;
    int len = -1;
    int size = PATH_CHUNK_SIZE;

    forever {
        s = (char *)::realloc(s, size);
        len = ::readlink(localSymlinkPath.constData(), s, size);
        if (len < 0) {
            ::free(s);
            break;
        }
        if (len < size)
            break;
        size *= 2;
    }
#  else
    char s[PATH_MAX+1];
    int len = readlink(localSymlinkPath.constData(), s, PATH_MAX);
#  endif
    if (len <= 0)
        return false;
    *target = QFile::decodeName(QByteArray(s, len));
#  if defined(__GLIBC__) && !defined(PATH_MAX)
    ::free(s);
#  endif
    return true;
}